

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnBrTableExpr
          (BinaryReaderLogging *this,Index num_targets,Index *target_depths,
          Index default_target_depth)

{
  Enum EVar1;
  uint local_30;
  Index i;
  Index default_target_depth_local;
  Index *target_depths_local;
  Index num_targets_local;
  BinaryReaderLogging *this_local;
  
  WriteIndent(this);
  Stream::Writef(this->stream_,"OnBrTableExpr(num_targets: %u, depths: [",(ulong)num_targets);
  for (local_30 = 0; local_30 < num_targets; local_30 = local_30 + 1) {
    Stream::Writef(this->stream_,"%u",(ulong)target_depths[local_30]);
    if (local_30 != num_targets - 1) {
      Stream::Writef(this->stream_,", ");
    }
  }
  Stream::Writef(this->stream_,"], default: %u)\n",(ulong)default_target_depth);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x4f])
                    (this->reader_,(ulong)num_targets,target_depths,(ulong)default_target_depth);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnBrTableExpr(Index num_targets,
                                          Index* target_depths,
                                          Index default_target_depth) {
  LOGF("OnBrTableExpr(num_targets: %" PRIindex ", depths: [", num_targets);
  for (Index i = 0; i < num_targets; ++i) {
    LOGF_NOINDENT("%" PRIindex, target_depths[i]);
    if (i != num_targets - 1) {
      LOGF_NOINDENT(", ");
    }
  }
  LOGF_NOINDENT("], default: %" PRIindex ")\n", default_target_depth);
  return reader_->OnBrTableExpr(num_targets, target_depths,
                                default_target_depth);
}